

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotPieChart<unsigned_short>
               (char **label_ids,unsigned_short *values,int count,double x,double y,double radius,
               bool normalize,char *fmt,double angle0)

{
  ImU32 col;
  double dVar1;
  double dVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  ImPlotContext *pIVar5;
  double dVar6;
  double dVar7;
  bool bVar8;
  ImGuiID key;
  ulong uVar9;
  ImPlotItem *pIVar10;
  undefined7 in_register_00000009;
  byte bVar11;
  uint uVar12;
  ulong uVar13;
  int i;
  ulong uVar14;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar15;
  double dVar16;
  double dVar17;
  ImVec4 IVar18;
  ImPlotPoint center;
  char buffer [32];
  float local_e8;
  float fStack_e4;
  ImPlotPoint local_c8;
  undefined1 local_b8 [16];
  double local_a8;
  char *local_a0;
  double local_98;
  ImDrawList *local_90;
  undefined4 local_88;
  int local_84;
  unsigned_short *local_80;
  double local_78;
  char **local_70;
  double local_68;
  ImVec2 local_60;
  char local_58 [40];
  
  local_a0 = fmt;
  local_70 = label_ids;
  if (GImPlot->CurrentPlot == (ImPlotPlot *)0x0) {
    __assert_fail("(GImPlot->CurrentPlot != __null) && \"PlotPieChart() needs to be called between BeginPlot() and EndPlot()!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot_items.cpp"
                  ,0x6b2,
                  "void ImPlot::PlotPieChart(const char *const *, const T *, int, double, double, double, bool, const char *, double) [T = unsigned short]"
                 );
  }
  uVar14 = CONCAT71(in_register_00000009,normalize) & 0xffffffff;
  local_90 = GetPlotDrawList();
  uVar13 = (ulong)(uint)count;
  local_98 = 0.0;
  if (0 < count) {
    uVar9 = 0;
    do {
      local_98 = local_98 + (double)values[uVar9];
      uVar9 = uVar9 + 1;
    } while (uVar13 != uVar9);
  }
  bVar8 = 1.0 < local_98;
  local_c8.x = x;
  local_c8.y = y;
  PushPlotClipRect(0.0);
  if (0 < count) {
    bVar11 = (byte)uVar14 | bVar8;
    local_88 = (undefined4)CONCAT71((int7)(uVar14 >> 8),bVar11);
    local_78 = local_98;
    if (bVar11 == 0) {
      local_78 = 1.0;
    }
    dVar15 = ((angle0 + angle0) * 3.1415927410125732) / 360.0;
    uVar14 = 0;
    dVar17 = dVar15;
    local_84 = count;
    local_80 = values;
    do {
      dVar16 = (double)values[uVar14] / local_78;
      local_a8 = dVar16 * 6.2831854820251465 + dVar17;
      bVar8 = BeginItem(local_70[uVar14],-1);
      if (bVar8) {
        col = GImPlot->CurrentItem->Color;
        if (0.5 <= dVar16) {
          dVar16 = local_a8 - dVar17;
          if (RenderPieSlice(ImDrawList&,ImPlotPoint_const&,double,double,double,unsigned_int)::
              buffer == '\0') {
            PlotPieChart<unsigned_short>();
          }
          dVar16 = dVar16 * 0.5 + dVar17;
          RenderPieSlice(ImDrawList&,ImPlotPoint_const&,double,double,double,unsigned_int)::buffer.
          _0_8_ = PlotToPixels(&local_c8,-1);
          uVar12 = (uint)((dVar16 - dVar17) * 7.957746982574463);
          if ((int)uVar12 < 4) {
            uVar12 = 3;
          }
          local_68 = (dVar16 - dVar17) / (double)(int)(uVar12 - 1);
          uVar9 = 0;
          do {
            dVar6 = local_c8.x;
            dVar1 = (double)(int)uVar9 * local_68 + dVar17;
            local_b8._0_8_ = dVar1;
            dVar1 = cos(dVar1);
            dVar7 = local_c8.y;
            dVar2 = sin((double)local_b8._0_8_);
            IVar3 = PlotToPixels(dVar1 * radius + dVar6,dVar7 + dVar2 * radius,-1);
            *(ImVec2 *)
             (RenderPieSlice(ImDrawList&,ImPlotPoint_const&,double,double,double,unsigned_int)::
              buffer + uVar9 * 8 + 8) = IVar3;
            uVar9 = uVar9 + 1;
          } while (uVar12 != uVar9);
          ImDrawList::AddConvexPolyFilled
                    (local_90,(ImVec2 *)
                              RenderPieSlice(ImDrawList&,ImPlotPoint_const&,double,double,double,unsigned_int)
                              ::buffer,uVar12 + 1,col);
          if (RenderPieSlice(ImDrawList&,ImPlotPoint_const&,double,double,double,unsigned_int)::
              buffer == '\0') {
            PlotPieChart<unsigned_short>();
          }
          RenderPieSlice(ImDrawList&,ImPlotPoint_const&,double,double,double,unsigned_int)::buffer.
          _0_8_ = PlotToPixels(&local_c8,-1);
          dVar17 = local_a8 - dVar16;
          uVar12 = (uint)(dVar17 * 7.957746982574463);
          if ((int)uVar12 < 4) {
            uVar12 = 3;
          }
          uVar9 = 0;
          do {
            dVar6 = local_c8.x;
            dVar1 = (double)(int)uVar9 * (dVar17 / (double)(int)(uVar12 - 1)) + dVar16;
            dVar2 = cos(dVar1);
            local_b8._0_8_ = local_c8.y;
            dVar1 = sin(dVar1);
            IVar3 = PlotToPixels(dVar2 * radius + dVar6,(double)local_b8._0_8_ + dVar1 * radius,-1);
            *(ImVec2 *)
             (RenderPieSlice(ImDrawList&,ImPlotPoint_const&,double,double,double,unsigned_int)::
              buffer + uVar9 * 8 + 8) = IVar3;
            uVar9 = uVar9 + 1;
          } while (uVar12 != uVar9);
        }
        else {
          if (RenderPieSlice(ImDrawList&,ImPlotPoint_const&,double,double,double,unsigned_int)::
              buffer == '\0') {
            PlotPieChart<unsigned_short>();
          }
          RenderPieSlice(ImDrawList&,ImPlotPoint_const&,double,double,double,unsigned_int)::buffer.
          _0_8_ = PlotToPixels(&local_c8,-1);
          dVar16 = local_a8 - dVar17;
          uVar12 = (uint)(dVar16 * 7.957746982574463);
          if ((int)uVar12 < 4) {
            uVar12 = 3;
          }
          uVar9 = 0;
          do {
            dVar6 = local_c8.x;
            dVar1 = (double)(int)uVar9 * (dVar16 / (double)(int)(uVar12 - 1)) + dVar17;
            local_b8._0_8_ = dVar1;
            dVar1 = cos(dVar1);
            dVar7 = local_c8.y;
            dVar2 = sin((double)local_b8._0_8_);
            IVar3 = PlotToPixels(dVar1 * radius + dVar6,dVar7 + dVar2 * radius,-1);
            *(ImVec2 *)
             (RenderPieSlice(ImDrawList&,ImPlotPoint_const&,double,double,double,unsigned_int)::
              buffer + uVar9 * 8 + 8) = IVar3;
            uVar9 = uVar9 + 1;
          } while (uVar12 != uVar9);
        }
        ImDrawList::AddConvexPolyFilled
                  (local_90,(ImVec2 *)
                            RenderPieSlice(ImDrawList&,ImPlotPoint_const&,double,double,double,unsigned_int)
                            ::buffer,uVar12 + 1,col);
        pIVar5 = GImPlot;
        PopPlotClipRect();
        ImPlotNextItemData::Reset(&pIVar5->NextItemData);
        pIVar5->PreviousItem = pIVar5->CurrentItem;
        pIVar5->CurrentItem = (ImPlotItem *)0x0;
        values = local_80;
      }
      uVar14 = uVar14 + 1;
      dVar17 = local_a8;
    } while (uVar14 != uVar13);
    if ((local_a0 != (char *)0x0) && (0 < local_84)) {
      if ((char)local_88 == '\0') {
        local_98 = 1.0;
      }
      uVar14 = 0;
      do {
        pIVar5 = GImPlot;
        key = ImGui::GetID(local_70[uVar14]);
        pIVar10 = ImPool<ImPlotItem>::GetByKey(&pIVar5->CurrentPlot->Items,key);
        dVar17 = ((double)local_80[uVar14] / local_98) * 6.2831854820251465 + dVar15;
        if (pIVar10->Show == true) {
          sprintf(local_58,local_a0,SUB84((double)local_80[uVar14],0));
          IVar3 = ImGui::CalcTextSize(local_58,(char *)0x0,false,-1.0);
          dVar15 = (dVar17 - dVar15) * 0.5 + dVar15;
          local_b8._0_8_ = local_c8.x;
          dVar16 = cos(dVar15);
          dVar1 = local_c8.y;
          local_b8._0_8_ = dVar16 * radius * 0.5 + (double)local_b8._0_8_;
          dVar15 = sin(dVar15);
          IVar4 = PlotToPixels((double)local_b8._0_8_,dVar1 + dVar15 * radius * 0.5,-1);
          local_b8._8_4_ = extraout_XMM0_Dc;
          local_b8._0_4_ = IVar4.x;
          local_b8._4_4_ = IVar4.y;
          local_b8._12_4_ = extraout_XMM0_Dd;
          IVar18 = ImGui::ColorConvertU32ToFloat4(pIVar10->Color);
          local_e8 = IVar3.x;
          fStack_e4 = IVar3.y;
          local_60.y = fStack_e4 * -0.5 + (float)local_b8._4_4_;
          local_60.x = local_e8 * -0.5 + (float)local_b8._0_4_;
          ImDrawList::AddText(local_90,&local_60,
                              -(uint)(IVar18.z * 0.114 + IVar18.x * 0.299 + IVar18.y * 0.587 <= 0.5)
                              | 0xff000000,local_58,(char *)0x0);
        }
        uVar14 = uVar14 + 1;
        dVar15 = dVar17;
      } while (uVar13 != uVar14);
    }
  }
  PopPlotClipRect();
  return;
}

Assistant:

void PlotPieChart(const char* const label_ids[], const T* values, int count, double x, double y, double radius, bool normalize, const char* fmt, double angle0) {
    IM_ASSERT_USER_ERROR(GImPlot->CurrentPlot != NULL, "PlotPieChart() needs to be called between BeginPlot() and EndPlot()!");
    ImDrawList & DrawList = *GetPlotDrawList();
    double sum = 0;
    for (int i = 0; i < count; ++i)
        sum += (double)values[i];
    normalize = normalize || sum > 1.0;
    ImPlotPoint center(x,y);
    PushPlotClipRect();
    double a0 = angle0 * 2 * IM_PI / 360.0;
    double a1 = angle0 * 2 * IM_PI / 360.0;
    for (int i = 0; i < count; ++i) {
        double percent = normalize ? (double)values[i] / sum : (double)values[i];
        a1 = a0 + 2 * IM_PI * percent;
        if (BeginItem(label_ids[i])) {
            ImU32 col = GetCurrentItem()->Color;
            if (percent < 0.5) {
                RenderPieSlice(DrawList, center, radius, a0, a1, col);
            }
            else  {
                RenderPieSlice(DrawList, center, radius, a0, a0 + (a1 - a0) * 0.5, col);
                RenderPieSlice(DrawList, center, radius, a0 + (a1 - a0) * 0.5, a1, col);
            }
            EndItem();
        }
        a0 = a1;
    }
    if (fmt != NULL) {
        a0 = angle0 * 2 * IM_PI / 360.0;
        a1 = angle0 * 2 * IM_PI / 360.0;
        char buffer[32];
        for (int i = 0; i < count; ++i) {
            ImPlotItem* item = GetItem(label_ids[i]);
            double percent = normalize ? (double)values[i] / sum : (double)values[i];
            a1 = a0 + 2 * IM_PI * percent;
            if (item->Show) {
                sprintf(buffer, fmt, (double)values[i]);
                ImVec2 size = ImGui::CalcTextSize(buffer);
                double angle = a0 + (a1 - a0) * 0.5;
                ImVec2 pos = PlotToPixels(center.x + 0.5 * radius * cos(angle), center.y + 0.5 * radius * sin(angle));
                ImU32 col  = CalcTextColor(ImGui::ColorConvertU32ToFloat4(item->Color));
                DrawList.AddText(pos - size * 0.5f, col, buffer);
            }
            a0 = a1;
        }
    }
    PopPlotClipRect();
}